

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

string * cs_impl::runtime_cs_ext::get_import_path_abi_cxx11_(void)

{
  long lVar1;
  undefined *puVar2;
  string *in_RDI;
  
  puVar2 = cs::current_process;
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  lVar1 = *(long *)(puVar2 + 0x58);
  std::__cxx11::string::_M_construct<char*>((string *)in_RDI,lVar1,*(long *)(puVar2 + 0x60) + lVar1)
  ;
  return in_RDI;
}

Assistant:

string get_import_path()
		{
			return current_process->import_path;
		}